

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csafestring.c
# Opt level: O0

csafestring_t * safe_clone(csafestring_t *obj)

{
  csafestring_t *pcVar1;
  char *pcVar2;
  undefined8 *in_RDI;
  csafestring_t *clone;
  
  pcVar1 = (csafestring_t *)malloc(0x10);
  pcVar1->buffer_length = in_RDI[1];
  pcVar2 = (char *)malloc(pcVar1->buffer_length);
  pcVar1->data = pcVar2;
  memcpy(pcVar1->data,(void *)*in_RDI,pcVar1->buffer_length);
  return pcVar1;
}

Assistant:

csafestring_t *safe_clone(csafestring_t *obj) {
	csafestring_t *clone = (csafestring_t *) malloc(sizeof(csafestring_t));
	clone->buffer_length = obj->buffer_length;
	clone->data = malloc(clone->buffer_length);
	memcpy(clone->data, obj->data, clone->buffer_length);

#ifdef EXPERIMENTAL_SIZING
	clone->sizing_size = obj->sizing_size;
	sizing_size += clone->sizing_size;
	sizing_count++;
#endif
	
	return clone;
}